

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O1

int TRD_PrepareIncFile(fullpath_ref_t trd,char *filename,aint *offset,aint *length)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  FILE *__stream;
  ulong uVar8;
  size_t __n;
  int Lname;
  byte trdFormName [12];
  STrdHead trdHead;
  int local_97c;
  path local_978;
  pointer local_950;
  char *local_948;
  byte local_93c [12];
  STrdHead local_930;
  
  local_97c = 0;
  local_948 = filename;
  TRD_FileNameToBytes(filename,local_93c,&local_97c);
  memset(&local_930.info,0,0xe2);
  local_930.info.freeTrack = '\x01';
  local_930.info.diskType = '\x16';
  local_930.info.numOfFiles = '\0';
  local_930.info.numOfFreeSectors = 0x9f0;
  local_930.info.trDosId = '\x10';
  local_930.info._unused2[0] = '\0';
  local_930.info._unused2[1] = '\0';
  builtin_memcpy(local_930.info.password,"         ",9);
  local_930.info._unused3[0] = '\0';
  local_930.info.numOfDeleted = '\0';
  builtin_memcpy(local_930.info.label,"        ",8);
  local_930.info._unused4[0] = '\0';
  local_930.info._unused4[1] = '\0';
  local_930.info._unused4[2] = '\0';
  __stream = (FILE *)SJ_fopen(&trd->full,"rb");
  if (__stream == (FILE *)0x0) {
    local_950 = (trd->str)._M_dataplus._M_p;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_978,&local_950,auto_format);
    ReturnWithError("[INCTRD] Error opening file",&local_978,(FILE *)0x0);
  }
  else {
    bVar3 = STrdHead::readFromFile(&local_930,(FILE *)__stream);
    if (!bVar3) {
      local_950 = (trd->str)._M_dataplus._M_p;
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (&local_978,&local_950,auto_format);
      ReturnWithError("TRD image read error",&local_978,(FILE *)__stream);
      std::filesystem::__cxx11::path::~path(&local_978);
      return 0;
    }
    fclose(__stream);
    __n = (size_t)local_97c;
    uVar8 = 0;
    do {
      uVar6 = (uint)uVar8;
      if (local_930.catalog[uVar8].filename[0] == '\0') {
        uVar6 = 0x80;
        bVar3 = false;
      }
      else {
        iVar4 = bcmp(local_930.catalog + uVar8,local_93c,__n);
        bVar3 = iVar4 != 0;
      }
      uVar5 = uVar6;
      if (!bVar3) break;
      uVar5 = uVar6 + 1;
      uVar8 = (ulong)uVar5;
    } while (uVar6 < 0x7f);
    if (uVar5 == 0x80) {
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (&local_978,&local_948,auto_format);
      ReturnWithError("[INCTRD] File not found in TRD image",&local_978,(FILE *)0x0);
    }
    else {
      if (*length == 0x7fffffff) {
        uVar6 = (uint)local_930.catalog[uVar5].length;
        *length = uVar6;
        *length = uVar6 - *offset;
      }
      iVar7 = (uint)local_930.catalog[uVar5].startSector * 0x100 +
              (uint)local_930.catalog[uVar5].startTrack * 0x1000;
      uVar1 = local_930.catalog[uVar5].length;
      iVar2 = *offset;
      iVar4 = iVar7 + iVar2;
      *offset = iVar4;
      if (((-1 < iVar2) && (0 < *length)) && (*length + iVar4 <= (int)(iVar7 + (uint)uVar1))) {
        return 1;
      }
      std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                (&local_978,&bp,auto_format);
      ReturnWithError("[INCTRD] File too short to cover requested offset and length",&local_978,
                      (FILE *)0x0);
    }
  }
  std::filesystem::__cxx11::path::~path(&local_978);
  return 0;
}

Assistant:

int TRD_PrepareIncFile(fullpath_ref_t trd, const char* filename, aint & offset, aint & length) {
	// parse filename into TRD file form (max 8+3, don't warn about 3-letter extension)
	byte trdFormName[12];
	int Lname = 0;
	TRD_FileNameToBytes(filename, trdFormName, Lname);	// ignore diagnostic info about extension

	// read 9 sectors of disk into "trdHead" (contains root directory catalog and disk info data)
	STrdHead trdHead;
	FILE* ff = SJ_fopen(trd.full, "rb");
	if (nullptr == ff) return ReturnWithError("[INCTRD] Error opening file", trd.str.c_str(), ff);
	if (!trdHead.readFromFile(ff)) {
		return ReturnWithError("TRD image read error", trd.str.c_str(), ff);
	}
	fclose(ff);
	ff = nullptr;

	// find the requested file
	unsigned fileIndex = 0;
	for (fileIndex = 0; fileIndex < STrdHead::NUM_OF_FILES_MAX; ++fileIndex) {
		const auto & entry = trdHead.catalog[fileIndex];
		if (0 == entry.filename[0]) {	// beyond last FAT record, finish the loop
			fileIndex = STrdHead::NUM_OF_FILES_MAX;
			break;
		} else {
			if (!memcmp(entry.filename, trdFormName, Lname)) break;	// found!
		}
	}
	if (STrdHead::NUM_OF_FILES_MAX == fileIndex) {
		return ReturnWithError("[INCTRD] File not found in TRD image", filename, ff);
	}

	// calculate absolute file offset and length + validate input values
	const auto & entry = trdHead.catalog[fileIndex];
	if (INT_MAX == length) {
		length = entry.length;
		length -= offset;
	}
	const aint fileOffset = STrdDisc::fileOffset(entry.startTrack, entry.startSector);
	const aint fileEnd = fileOffset + entry.length;
	offset += fileOffset;

	// report success when resulting offset + length fits into the file definition
	if (fileOffset <= offset && (offset + length) <= fileEnd && 0 < length) return 1;

	return ReturnWithError("[INCTRD] File too short to cover requested offset and length", bp, ff);
}